

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.cpp
# Opt level: O2

void s_send_padding(socket_t *socket,string_view trace,int flags)

{
  bool bVar1;
  runtime_error *this;
  allocator<char> local_69;
  string_view trace_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  trace_local._M_str = trace._M_str;
  trace_local._M_len = trace._M_len;
  bVar1 = s_send_raw(socket,(string_view)ZEXT816(0),flags);
  if (bVar1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,&trace_local,&local_69);
  std::operator+(&local_38,"s_send_padding failed:",&local_58);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void s_send_padding(zmq::socket_t *socket, std::string_view trace, int flags) {
    if (!s_send_raw(socket, std::string_view{}, flags)) {
        throw std::runtime_error("s_send_padding failed:" + std::string(trace));
    }
}